

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void * prf_array_append_int(void *id,int elem)

{
  uint uVar1;
  long lVar2;
  undefined4 *__ptr;
  
  __ptr = (undefined4 *)((long)id + -8);
  if (*(uint *)((long)id + -8) <= *(uint *)((long)id + -4) >> 4) {
    lVar2 = (ulong)*(uint *)((long)id + -8) * 2;
    uVar1 = *(uint *)((long)id + -4);
    __ptr = (undefined4 *)realloc(__ptr,(ulong)(uVar1 & 0xf) * lVar2 + 8);
    *__ptr = (int)lVar2;
    __ptr[1] = uVar1;
    id = __ptr + 2;
  }
  uVar1 = __ptr[1];
  __ptr[1] = uVar1 + 0x10;
  *(int *)((long)id + (ulong)(uVar1 >> 4) * 4) = elem;
  return (undefined4 *)id;
}

Assistant:

void *
prf_array_append_int(void *id, int elem)
{
  int *ptr;
  array *arr; 
  
  arr = id_to_array(id);
  if (arr->numelem >= arr->size) {
    id = prf_array_set_size(id, arr->size<<1);
    arr = id_to_array(id);
  }
  ptr = (int*)id;
  ptr[arr->numelem++] = elem;
  return id;
}